

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_image_dds.cxx
# Opt level: O1

bool __thiscall xray_re::xr_image::load_dds(xr_image *this,string *path)

{
  bool bVar1;
  uint uVar2;
  rgba32 *prVar3;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d8d_for_Color32_0_0 *paVar4;
  uint uVar5;
  ulong uVar7;
  Image image;
  DirectDrawSurface dds;
  Image IStack_e8;
  DirectDrawSurface local_d0;
  ulong uVar6;
  
  nv::DirectDrawSurface::DirectDrawSurface(&local_d0,(path->_M_dataplus)._M_p);
  bVar1 = nv::DirectDrawSurface::isValid(&local_d0);
  if (bVar1) {
    bVar1 = nv::DirectDrawSurface::isTexture2D(&local_d0);
    if (bVar1) {
      nv::Image::Image(&IStack_e8);
      nv::DirectDrawSurface::mipmap(&local_d0,&IStack_e8,0,0);
      uVar2 = nv::Image::width(&IStack_e8);
      this->m_width = uVar2;
      uVar2 = nv::Image::height(&IStack_e8);
      this->m_height = uVar2;
      uVar5 = uVar2 * this->m_width;
      uVar6 = (ulong)uVar5;
      prVar3 = (rgba32 *)operator_new__(uVar6 * 4);
      this->m_data = prVar3;
      if (uVar5 != 0) {
        uVar7 = (ulong)(uVar5 - 1);
        do {
          paVar4 = (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d8d_for_Color32_0_0 *)
                   nv::Image::pixel(&IStack_e8,(uint)uVar7);
          ((anon_union_4_2_12391d8d_for_Color32_0 *)(this->m_data + uVar7))->field_0 = *paVar4;
          uVar7 = uVar7 - 1;
          uVar5 = (int)uVar6 - 1;
          uVar6 = (ulong)uVar5;
        } while (uVar5 != 0);
      }
      nv::Image::~Image(&IStack_e8);
      bVar1 = true;
      goto LAB_00162e96;
    }
  }
  bVar1 = false;
LAB_00162e96:
  nv::DirectDrawSurface::~DirectDrawSurface(&local_d0);
  return bVar1;
}

Assistant:

bool xr_image::load_dds(const std::string& path)
{
	nv::DirectDrawSurface dds(path.c_str());
	if (!dds.isValid() || !dds.isTexture2D())
		return false;
	nv::Image image;
	dds.mipmap(&image, 0, 0);
	m_width = image.width();
	m_height = image.height();
	m_data = new rgba32[m_width*m_height];
	for (unsigned i = m_height*m_width; i > 0;) {
		const nv::Color32& pix = image.pixel(--i);
		m_data[i] = pix.u;
	}
	return true;
}